

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QTableWidgetSelectionRange>::emplace<QTableWidgetSelectionRange>
          (QMovableArrayOps<QTableWidgetSelectionRange> *this,qsizetype i,
          QTableWidgetSelectionRange *args)

{
  QTableWidgetSelectionRange **ppQVar1;
  QTableWidgetSelectionRange *pQVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Data *pDVar7;
  QTableWidgetSelectionRange *pQVar8;
  qsizetype *pqVar9;
  bool bVar10;
  
  pDVar7 = (this->super_QGenericArrayOps<QTableWidgetSelectionRange>).
           super_QArrayDataPointer<QTableWidgetSelectionRange>.d;
  if ((pDVar7 != (Data *)0x0) &&
     ((__int_type)(pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if (((this->super_QGenericArrayOps<QTableWidgetSelectionRange>).
         super_QArrayDataPointer<QTableWidgetSelectionRange>.size == i) &&
       (pQVar8 = (this->super_QGenericArrayOps<QTableWidgetSelectionRange>).
                 super_QArrayDataPointer<QTableWidgetSelectionRange>.ptr,
       (pDVar7->super_QArrayData).alloc !=
       ((long)((long)pQVar8 -
              ((ulong)((long)&pDVar7[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 4) +
       i)) {
      iVar3 = args->m_left;
      iVar4 = args->m_bottom;
      iVar5 = args->m_right;
      pQVar8 = pQVar8 + i;
      pQVar8->m_top = args->m_top;
      pQVar8->m_left = iVar3;
      pQVar8->m_bottom = iVar4;
      pQVar8->m_right = iVar5;
      goto LAB_0059aca6;
    }
    if ((i == 0) &&
       (pQVar8 = (this->super_QGenericArrayOps<QTableWidgetSelectionRange>).
                 super_QArrayDataPointer<QTableWidgetSelectionRange>.ptr,
       (QTableWidgetSelectionRange *)
       ((ulong)((long)&pDVar7[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) != pQVar8)) {
      iVar3 = args->m_left;
      iVar4 = args->m_bottom;
      iVar5 = args->m_right;
      pQVar8[-1].m_top = args->m_top;
      pQVar8[-1].m_left = iVar3;
      pQVar8[-1].m_bottom = iVar4;
      pQVar8[-1].m_right = iVar5;
      ppQVar1 = &(this->super_QGenericArrayOps<QTableWidgetSelectionRange>).
                 super_QArrayDataPointer<QTableWidgetSelectionRange>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
      goto LAB_0059aca6;
    }
  }
  iVar3 = args->m_top;
  iVar4 = args->m_left;
  iVar5 = args->m_bottom;
  iVar6 = args->m_right;
  bVar10 = (this->super_QGenericArrayOps<QTableWidgetSelectionRange>).
           super_QArrayDataPointer<QTableWidgetSelectionRange>.size != 0;
  QArrayDataPointer<QTableWidgetSelectionRange>::detachAndGrow
            ((QArrayDataPointer<QTableWidgetSelectionRange> *)this,(uint)(i == 0 && bVar10),1,
             (QTableWidgetSelectionRange **)0x0,(QArrayDataPointer<QTableWidgetSelectionRange> *)0x0
            );
  pQVar8 = (this->super_QGenericArrayOps<QTableWidgetSelectionRange>).
           super_QArrayDataPointer<QTableWidgetSelectionRange>.ptr;
  if (i == 0 && bVar10) {
    pQVar8[-1].m_top = iVar3;
    pQVar8[-1].m_left = iVar4;
    pQVar8[-1].m_bottom = iVar5;
    pQVar8[-1].m_right = iVar6;
    (this->super_QGenericArrayOps<QTableWidgetSelectionRange>).
    super_QArrayDataPointer<QTableWidgetSelectionRange>.ptr = pQVar8 + -1;
  }
  else {
    pQVar2 = pQVar8 + i;
    memmove(pQVar2 + 1,pQVar8 + i,
            ((this->super_QGenericArrayOps<QTableWidgetSelectionRange>).
             super_QArrayDataPointer<QTableWidgetSelectionRange>.size - i) * 0x10);
    pQVar2->m_top = iVar3;
    pQVar2->m_left = iVar4;
    pQVar2->m_bottom = iVar5;
    pQVar2->m_right = iVar6;
  }
LAB_0059aca6:
  pqVar9 = &(this->super_QGenericArrayOps<QTableWidgetSelectionRange>).
            super_QArrayDataPointer<QTableWidgetSelectionRange>.size;
  *pqVar9 = *pqVar9 + 1;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }